

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O3

UEnumeration * ucol_openAvailableLocales_63(UErrorCode *status)

{
  StringEnumeration *adopted;
  UEnumeration *pUVar1;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    adopted = icu_63::Collator::getAvailableLocales();
    if (adopted != (StringEnumeration *)0x0) {
      pUVar1 = uenum_openFromStringEnumeration_63(adopted,status);
      return pUVar1;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return (UEnumeration *)0x0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}